

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music.c
# Opt level: O2

int do_play_instrument(obj *instr)

{
  int *piVar1;
  byte bVar2;
  short sVar3;
  char cVar4;
  boolean bVar5;
  schar sVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  size_t sVar12;
  trap *ptVar13;
  obj *obj;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int tmp;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  monst *pmVar23;
  char *pcVar24;
  monst *pmVar25;
  long lVar26;
  ulong uVar27;
  uint x;
  long lVar28;
  bool bVar29;
  schar dy;
  schar dz;
  boolean matched [5];
  char buf [256];
  
  if ((u._1052_1_ & 2) != 0) {
    pline("You can\'t play music underwater!");
    return 0;
  }
  if (((instr->otyp & 0xfffeU) != 0x106) &&
     (cVar4 = yn_function("Improvise?","yn",'n'), cVar4 == 'n')) {
    if (((u.uevent._0_2_ & 0xc0) == 0x80) &&
       (cVar4 = yn_function("Play the passtune?","yn",'n'), cVar4 == 'y')) {
      strcpy(buf,tune);
    }
    else {
      pcVar10 = buf;
      getlin("What tune are you playing? [5 notes, A-G]",pcVar10);
      mungspaces(pcVar10);
      for (; *pcVar10 != '\0'; pcVar10 = pcVar10 + 1) {
        cVar4 = highc(*pcVar10);
        if (cVar4 == 'H') {
          cVar4 = 'B';
        }
        *pcVar10 = cVar4;
      }
    }
    pcVar10 = xname(instr);
    pcVar10 = the(pcVar10);
    pline("You extract a strange sound from %s!",pcVar10);
    bVar5 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
    if (bVar5 == '\0') {
      return 1;
    }
    exercise(2,'\x01');
    iVar7 = strcmp(buf,tune);
    if (iVar7 == 0) {
      uVar14 = (uint)u.uy;
      _dy = uVar14 - 1;
      do {
        if ((char)uVar14 + 1 < (int)_dy) {
          return 1;
        }
        uVar14 = (uint)u.ux;
        for (matched._0_4_ = uVar14 - 1; (int)matched._0_4_ <= (char)uVar14 + 1;
            matched._0_4_ = matched._0_4_ + 1) {
          if ((matched._0_4_ - 1 < 0x4f) && (_dy < 0x15)) {
            bVar5 = find_drawbridge((int *)matched,(int *)&dy);
            if (bVar5 != '\0') {
              u.uevent = (u_event)((uint)u.uevent & 0xffffff3f | 0x80);
              if (level->locations[(int)matched._0_4_][(int)_dy].typ != '$') {
                open_drawbridge(matched._0_4_,_dy);
                return 1;
              }
              close_drawbridge(matched._0_4_,_dy);
              return 1;
            }
            uVar14 = (uint)(byte)u.ux;
          }
        }
        _dy = _dy + 1;
        uVar14 = (uint)(byte)u.uy;
      } while( true );
    }
    if (flags.soundok == '\0') {
      return 1;
    }
    if (((uint)u.uevent & 0xc0) == 0) {
      u.uevent = (u_event)((uint)u.uevent | 0x40);
    }
    uVar14 = (uint)u.uy;
    bVar29 = false;
    for (uVar20 = uVar14 - 1; (!bVar29 && ((int)uVar20 <= (char)uVar14 + 1)); uVar20 = uVar20 + 1) {
      uVar15 = (uint)u.ux;
      bVar29 = false;
      uVar14 = uVar15 - 2;
      while ((!bVar29 && (x = uVar14 + 1, (int)x <= (char)uVar15 + 1))) {
        if (uVar14 < 0x4f && uVar20 < 0x15) {
          cVar4 = level->locations[x][uVar20].typ;
          bVar29 = true;
          uVar14 = x;
          if ((cVar4 != '\x14') && (cVar4 != '$')) {
            iVar7 = is_drawbridge_wall(x,uVar20);
            bVar29 = -1 < iVar7;
            uVar15 = (uint)(byte)u.ux;
          }
        }
        else {
          bVar29 = false;
          uVar14 = x;
        }
      }
      uVar14 = (uint)(byte)u.uy;
    }
    if (!bVar29) {
      return 1;
    }
    for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
      matched[lVar11] = '\0';
    }
    sVar12 = strlen(buf);
    uVar17 = 0;
    uVar27 = sVar12 & 0xffffffff;
    if ((int)sVar12 < 1) {
      uVar27 = uVar17;
    }
    uVar21 = 0;
    uVar14 = 0;
    do {
      iVar7 = (int)uVar21;
      if (uVar17 == uVar27) {
        if (iVar7 != 0) {
          pcVar24 = "s";
          pcVar10 = "s";
          if (iVar7 == 1) {
            pcVar10 = "";
          }
          if (uVar14 == 0) {
            You_hear("%d tumbler%s click.",uVar21,pcVar10);
            return 1;
          }
          if (uVar14 == 1) {
            pcVar24 = "";
          }
          You_hear("%d tumbler%s click and %d gear%s turn.",uVar21,pcVar10,(ulong)uVar14,pcVar24);
          return 1;
        }
        if (uVar14 == 0) {
          return 1;
        }
        pcVar10 = "s";
        if (uVar14 == 1) {
          pcVar10 = "";
        }
        You_hear("%d gear%s turn.",(ulong)uVar14,pcVar10);
        if (uVar14 == 5) {
          u.uevent = (u_event)((uint)u.uevent & 0xffffff3f | 0x80);
          return 1;
        }
        return 1;
      }
      if (uVar17 < 5) {
        cVar4 = buf[uVar17];
        if (cVar4 == tune[uVar17]) {
          uVar14 = uVar14 + 1;
          uVar19 = uVar17;
LAB_001f2790:
          matched[uVar19] = '\x01';
        }
        else {
          for (uVar19 = 0; uVar19 != 5; uVar19 = uVar19 + 1) {
            if (((matched[uVar19] == '\0') && (cVar4 == tune[uVar19])) && (buf[uVar19] != cVar4)) {
              uVar21 = (ulong)(iVar7 + 1);
              goto LAB_001f2790;
            }
          }
        }
      }
      uVar17 = uVar17 + 1;
    } while( true );
  }
  uVar14 = u.uprops[0x1c].intrinsic;
  if (u.uprops[0x1c].intrinsic == 0) {
    pcVar10 = xname(instr);
    the(pcVar10);
    pline("You start playing %s.");
  }
  else {
    pline("What you produce is quite far from music...");
  }
  switch(instr->otyp) {
  case 0xfd:
    if ((uVar14 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      pcVar10 = "soft";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar10 = "elevator";
        }
        else {
          bVar5 = dmgtype(youmonst.data,0x24);
          pcVar10 = "soft";
          if (bVar5 == '\0') {
            pcVar10 = "elevator";
          }
        }
      }
      pline("You produce %s music.",pcVar10);
      iVar7 = u.ulevel;
      iVar16 = u.ulevel * 5;
      pmVar25 = (monst *)&level->monlist;
      while (pmVar25 = pmVar25->nmon, pmVar25 != (monst *)0x0) {
        if ((0 < pmVar25->mhp) &&
           (iVar18 = dist2((int)pmVar25->mx,(int)pmVar25->my,(int)u.ux,(int)u.uy),
           SBORROW4(iVar18,iVar16) != iVar18 + iVar7 * -5 < 0)) {
          iVar22 = 10;
          for (iVar18 = -10; iVar18 != 0; iVar18 = iVar18 + 1) {
            uVar14 = mt_random();
            iVar22 = iVar22 + uVar14 % 10;
          }
          iVar18 = sleep_monst(pmVar25,iVar22,6);
          if (iVar18 != 0) {
            pmVar25->field_0x62 = pmVar25->field_0x62 | 8;
            slept_monst(pmVar25);
          }
        }
      }
      exercise(3,'\x01');
      iVar7 = 0xfd;
LAB_001f3214:
      makeknown_msg(iVar7);
      return 2;
    }
  case 0xfc:
    sVar6 = acurr(3);
    iVar7 = rn2((int)sVar6);
    bVar29 = 0x19 < iVar7 + u.ulevel;
    pcVar10 = "toot";
    if (uVar14 == 0 && bVar29) {
      pcVar10 = "trill";
    }
    pcVar10 = Tobjnam(instr,pcVar10);
    pline("%s.",pcVar10);
    iVar7 = u.ulevel;
    if (uVar14 == 0 && bVar29) {
      iVar16 = u.ulevel * 3;
      pmVar25 = (monst *)&level->monlist;
LAB_001f2244:
      pmVar25 = pmVar25->nmon;
      if (pmVar25 != (monst *)0x0) {
        if ((((0 < pmVar25->mhp) && (pmVar25->data->mlet == '-')) &&
            ((pmVar25->field_0x62 & 4) != 0)) &&
           (iVar18 = dist2((int)pmVar25->mx,(int)pmVar25->my,(int)u.ux,(int)u.uy),
           SBORROW4(iVar18,iVar16) != iVar18 + iVar7 * -3 < 0)) {
          uVar14 = *(uint *)&pmVar25->field_0x60;
          uVar20 = uVar14 & 0xffbf7fff | 0x400000;
          *(uint *)&pmVar25->field_0x60 = uVar20;
          if (pmVar25->wormno == '\0') {
            if ((viz_array[pmVar25->my][pmVar25->mx] & 2U) != 0) goto LAB_001f2312;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f22fc;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f22f3;
            }
            else {
LAB_001f22f3:
              if (ublindf == (obj *)0x0) goto LAB_001f23b1;
LAB_001f22fc:
              if (ublindf->oartifact != '\x1d') goto LAB_001f23b1;
            }
            if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_001f23b1;
            bVar29 = false;
            if (((viz_array[pmVar25->my][pmVar25->mx] & 1U) != 0) &&
               (bVar29 = false, (pmVar25->data->mflags3 & 0x200) != 0)) goto LAB_001f2312;
          }
          else {
            bVar5 = worm_known(level,pmVar25);
            uVar20 = *(uint *)&pmVar25->field_0x60;
            if (bVar5 == '\0') {
LAB_001f23b1:
              bVar29 = false;
            }
            else {
LAB_001f2312:
              if ((((uVar20 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((char)uVar20 < '\0') goto LAB_001f23b1;
              }
              else {
                bVar29 = false;
                if (((char)uVar20 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
                goto LAB_001f23b4;
              }
              bVar29 = (u._1052_1_ & 0x20) == 0 && (uVar20 >> 9 & 1) == 0;
            }
          }
LAB_001f23b4:
          *(uint *)&pmVar25->field_0x60 = uVar20 & 0xffffff7f;
          newsym((int)pmVar25->mx,(int)pmVar25->my);
          if (pmVar25->wormno == '\0') {
            if ((viz_array[pmVar25->my][pmVar25->mx] & 2U) == 0) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f242d;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f2424;
              }
              else {
LAB_001f2424:
                if (ublindf == (obj *)0x0) goto LAB_001f2244;
LAB_001f242d:
                if (ublindf->oartifact != '\x1d') goto LAB_001f2244;
              }
              if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                  ((viz_array[pmVar25->my][pmVar25->mx] & 1U) == 0)) ||
                 ((pmVar25->data->mflags3 & 0x200) == 0)) goto LAB_001f2244;
            }
          }
          else {
            bVar5 = worm_known(level,pmVar25);
            if (bVar5 == '\0') goto LAB_001f2244;
          }
          uVar20 = *(uint *)&pmVar25->field_0x60;
          if ((((uVar20 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar20 & 0x280) != 0) goto LAB_001f2244;
          }
          else if (((uVar20 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_001f2244;
          if ((u._1052_1_ & 0x20) == 0) {
            if (bVar29) {
              pcVar10 = Monnam(pmVar25);
              pcVar24 = "";
              if ((uVar14 >> 0x16 & 1) == 0) {
                pcVar24 = ", and now seems quieter";
              }
              pline("%s freezes, then sways with the music%s.",pcVar10,pcVar24);
            }
            else {
              pcVar10 = a_monnam(pmVar25);
              pline("You notice %s, swaying with the music.",pcVar10);
            }
          }
        }
        goto LAB_001f2244;
      }
    }
    break;
  case 0xff:
  case 0x100:
    if ((uVar14 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      iVar7 = getdir((char *)0x0,matched,&dy,&dz);
      if (iVar7 == 0) {
        pcVar10 = Tobjnam(instr,"vibrate");
        pline("%s.",pcVar10);
        return 2;
      }
      if (((matched[0] == '\0') && (dy == '\0')) && (dz == '\0')) {
        iVar7 = zapyourself(instr,'\x01');
        if (iVar7 != 0) {
          sprintf(buf,"using a magical horn on %sself",genders[flags.female != '\0'].him);
          losehp(iVar7,buf,1);
        }
      }
      else {
        sVar3 = instr->otyp;
        uVar14 = mt_random();
        buzz((sVar3 == 0xff) + 1,uVar14 % 6 + 6,u.ux,u.uy,(int)matched[0],(int)dy);
      }
      iVar7 = (int)instr->otyp;
      goto LAB_001f3214;
    }
  case 0xfe:
    pline("You produce a frightful, grave sound.");
    iVar7 = u.ulevel * 0x1e;
LAB_001f25aa:
    awaken_monsters(iVar7);
LAB_001f25af:
    exercise(2,'\0');
    return 2;
  default:
    warning("What a weird instrument (%d)!",(ulong)(uint)(int)instr->otyp);
    return 2;
  case 0x103:
    if ((uVar14 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      pcVar10 = Tobjnam(instr,"produce");
      pline("%s very attractive music.",pcVar10);
      iVar7 = u.ulevel + -1;
      if ((u._1052_1_ & 1) == 0) {
        pmVar25 = level->monlist;
        while (pmVar23 = pmVar25, pmVar23 != (monst *)0x0) {
          pmVar25 = pmVar23->nmon;
          if (((0 < pmVar23->mhp) &&
              (iVar16 = dist2((int)pmVar23->mx,(int)pmVar23->my,(int)u.ux,(int)u.uy),
              iVar16 <= iVar7 / 3 + 1)) && (iVar16 = resist(pmVar23,'\x06',0,0), iVar16 == 0)) {
            tamedog(pmVar23,(obj *)0x0);
          }
        }
      }
      else {
        iVar7 = resist(u.ustuck,'\x06',0,0);
        if (iVar7 == 0) {
          tamedog(u.ustuck,(obj *)0x0);
        }
      }
      exercise(3,'\x01');
      iVar7 = 0x103;
      goto LAB_001f3214;
    }
  case 0x102:
    sVar6 = acurr(3);
    iVar7 = rn2((int)sVar6);
    bVar29 = 0x19 < iVar7 + u.ulevel;
    pcVar10 = xname(instr);
    pcVar10 = The(pcVar10);
    pcVar24 = "twangs";
    if (uVar14 == 0 && bVar29) {
      pcVar24 = "produces a lilting melody";
    }
    pline("%s %s.",pcVar10,pcVar24);
    iVar7 = u.ulevel;
    if (uVar14 == 0 && bVar29) {
      iVar16 = u.ulevel * 3;
      pmVar25 = (monst *)&level->monlist;
LAB_001f1feb:
      pmVar25 = pmVar25->nmon;
      if (pmVar25 != (monst *)0x0) {
        if (((0 < pmVar25->mhp) && (pmVar25->data->mlet == '\x0e')) &&
           (((pmVar25->field_0x62 & 4) != 0 &&
            (iVar18 = dist2((int)pmVar25->mx,(int)pmVar25->my,(int)u.ux,(int)u.uy),
            SBORROW4(iVar18,iVar16) != iVar18 + iVar7 * -3 < 0)))) {
          uVar14 = *(uint *)&pmVar25->field_0x60 & 0xffb77fff | 0x400000;
          *(uint *)&pmVar25->field_0x60 = uVar14;
          if (pmVar25->wormno == '\0') {
            if ((viz_array[pmVar25->my][pmVar25->mx] & 2U) == 0) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f20a0;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f2097;
              }
              else {
LAB_001f2097:
                if (ublindf == (obj *)0x0) goto LAB_001f1feb;
LAB_001f20a0:
                if (ublindf->oartifact != '\x1d') goto LAB_001f1feb;
              }
              if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                  ((viz_array[pmVar25->my][pmVar25->mx] & 1U) == 0)) ||
                 ((pmVar25->data->mflags3 & 0x200) == 0)) goto LAB_001f1feb;
            }
          }
          else {
            bVar5 = worm_known(level,pmVar25);
            if (bVar5 == '\0') goto LAB_001f1feb;
            uVar14 = *(uint *)&pmVar25->field_0x60;
          }
          if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar14 & 0x280) != 0) goto LAB_001f1feb;
          }
          else if (((uVar14 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_001f1feb;
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar10 = Monnam(pmVar25);
            pline("%s listens cheerfully to the music, then seems quieter.",pcVar10);
          }
        }
        goto LAB_001f1feb;
      }
    }
    break;
  case 0x105:
    pcVar10 = xname(instr);
    the(pcVar10);
    pline("You extract a loud noise from %s.");
    awaken_soldiers();
    goto LAB_001f25af;
  case 0x106:
    goto switchD_001f1ee0_caseD_106;
  case 0x107:
    if ((uVar14 == 0) && ('\0' < instr->spe)) {
      consume_obj_charge(instr,'\x01');
      pline("You produce a heavy, thunderous rolling!");
      pcVar10 = get_generic_level_description(level);
      pline("The entire %s is shaking around you!",pcVar10);
      iVar7 = (u.ulevel + -1) / 3;
      iVar16 = iVar7 * 2 + 2;
      iVar18 = (int)u.ux + iVar7 * 2 + 2;
      uVar20 = u.ux - iVar16;
      iVar22 = (int)u.uy + iVar7 * 2 + 2;
      uVar14 = u.uy - iVar16;
      uVar27 = (ulong)uVar20;
      if ((int)uVar20 < 2) {
        uVar27 = 1;
      }
      uVar17 = (ulong)uVar14;
      if ((int)uVar14 < 2) {
        uVar17 = 1;
      }
      iVar16 = 0x4f;
      if (iVar18 < 0x4f) {
        iVar16 = iVar18;
      }
      iVar18 = 0x14;
      if (iVar22 < 0x14) {
        iVar18 = iVar22;
      }
      lVar28 = uVar27 * 0xa8 + 0x8380;
      lVar11 = uVar27 * 0xfc + uVar17 * 0xc + 0x46;
      for (; uVar21 = uVar17, lVar26 = lVar11, (long)uVar27 <= (long)iVar16; uVar27 = uVar27 + 1) {
        for (; (long)uVar21 <= (long)iVar18; uVar21 = uVar21 + 1) {
          pmVar25 = *(monst **)(level->levname + uVar21 * 8 + lVar28);
          iVar9 = (int)uVar27;
          iVar22 = (int)uVar21;
          if ((pmVar25 != (monst *)0x0) && ((pmVar25->field_0x61 & 2) == 0)) {
            wakeup(pmVar25);
            if (((char)*(uint *)&pmVar25->field_0x60 < '\0') &&
               ((pmVar25->data->mflags1 & 0x100) != 0)) {
              *(uint *)&pmVar25->field_0x60 = *(uint *)&pmVar25->field_0x60 & 0xffffff7f;
              if ((viz_array[uVar21][uVar27] & 2U) == 0) {
                You_hear("a thumping sound.");
              }
              else {
                pcVar10 = Amonnam(pmVar25);
                pline("%s is shaken loose from the ceiling!",pcVar10);
              }
              if ((uVar27 == (uint)(int)u.ux) && (uVar21 == (uint)(int)u.uy)) {
                pcVar10 = mon_nam(pmVar25);
                pline("You easily dodge the falling %s.",pcVar10);
              }
              newsym(iVar9,iVar22);
            }
          }
          iVar8 = rn2(0xd - iVar7);
          if (iVar8 != 0) goto switchD_001f2b44_caseD_1a;
          switch(level->levname[lVar26 + -2]) {
          case '\x17':
            if ((*(ushort *)(level->levname + lVar26) & 0x1f0) == 0) goto switchD_001f2b44_caseD_18;
            iVar8 = artifact_door(level,iVar9,iVar22);
            if (iVar8 != 0) goto switchD_001f2b44_caseD_1a;
            if ((viz_array[uVar21][uVar27] & 2U) != 0) {
              pline("The door collapses.");
            }
            pcVar10 = in_rooms(level,(xchar)uVar27,(xchar)uVar21,0x12);
            if (*pcVar10 != '\0') {
              add_damage((xchar)uVar27,(xchar)uVar21,0);
            }
            *(uint *)(level->levname + lVar26) = *(uint *)(level->levname + lVar26) & 0xfffffe0f;
            unblock_point(iVar9,iVar22);
            goto LAB_001f2e76;
          case '\x18':
          case '\x19':
            goto switchD_001f2b44_caseD_18;
          default:
            goto switchD_001f2b44_caseD_1a;
          case '\x1c':
            pcVar10 = "The fountain falls into a chasm.";
            if ((viz_array[uVar21][uVar27] & 2U) == 0) goto switchD_001f2b44_caseD_18;
            goto LAB_001f2bf1;
          case '\x1d':
            bVar2 = viz_array[uVar21][uVar27];
            pcVar10 = "The throne falls into a chasm.";
            break;
          case '\x1f':
            bVar2 = viz_array[uVar21][uVar27];
            pcVar10 = "The kitchen sink falls into a chasm.";
            break;
          case ' ':
            bVar2 = viz_array[uVar21][uVar27];
            pcVar10 = "The headstone topples into a chasm.";
            break;
          case '!':
            bVar5 = on_level(&u.uz,&dungeon_topology.d_astral_level);
            if ((bVar5 == '\0') &&
               (bVar5 = on_level(&u.uz,&dungeon_topology.d_sanctum_level), bVar5 == '\0')) {
              bVar2 = viz_array[uVar21][uVar27];
              pcVar10 = "The altar falls into a chasm.";
              break;
            }
            goto switchD_001f2b44_caseD_1a;
          }
          if ((bVar2 & 2) != 0) {
LAB_001f2bf1:
            pline(pcVar10);
          }
switchD_001f2b44_caseD_18:
          ptVar13 = maketrap(level,iVar9,iVar22,0xb);
          if (ptVar13 != (trap *)0x0) {
            ptVar13->field_0x8 = ptVar13->field_0x8 | 0x20;
            *(uint *)(level->levname + lVar26) = *(uint *)(level->levname + lVar26) & 0xfffffe0f;
            pmVar25 = *(monst **)(level->levname + uVar21 * 8 + lVar28);
            if (pmVar25 == (monst *)0x0) {
              pmVar25 = (monst *)0x0;
            }
            else if ((pmVar25->field_0x61 & 2) != 0) {
              pmVar25 = (monst *)0x0;
            }
            obj = sobj_at(0x214,level,iVar9,iVar22);
            if (obj == (obj *)0x0) {
              if (pmVar25 == (monst *)0x0) {
                if (((u.utrap == 0) && (uVar27 == (uint)(int)u.ux)) && (uVar21 == (uint)(int)u.uy))
                {
                  if (((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
                      ((youmonst.data)->mlet != '\x05')) &&
                     ((u.uprops[0x3c].extrinsic == 0 &&
                      (uVar14 = (youmonst.data)->mflags1, (uVar14 & 1) == 0)))) {
                    if (u.usteed == (monst *)0x0) {
                      if ((uVar14 & 0x10) == 0) goto LAB_001f2fa1;
                    }
                    else if ((uVar14 & 0x10) == 0 && ((u.usteed)->data->mflags1 & 1) == 0) {
LAB_001f2fa1:
                      iVar22 = 0x2a40dc;
                      pline("You fall into a chasm!");
                      uVar14 = mt_random();
                      u.utrap = uVar14 % 6 + 2;
                      u.utraptype = 1;
                      iVar22 = rnd(iVar22);
                      losehp(iVar22,"fell into a chasm",2);
                      selftouch("Falling, you");
                      goto switchD_001f2b44_caseD_1a;
                    }
                  }
                  pline("A chasm opens up under you!");
                  pline("You don\'t fall in!");
                }
                else {
LAB_001f2e76:
                  newsym(iVar9,iVar22);
                }
              }
              else if ((pmVar25->data->mflags1 & 0x11) == 0) {
                pmVar25->field_0x62 = pmVar25->field_0x62 | 0x80;
                if ((viz_array[uVar21][uVar27] & 2U) == 0) {
                  if ((flags.soundok != '\0') && ((pmVar25->data->mflags1 & 0x20000) != 0)) {
                    You_hear("a scream!");
                  }
                }
                else {
                  pcVar10 = Monnam(pmVar25);
                  pline("%s falls into a chasm!",pcVar10);
                }
                pmVar23 = pmVar25;
                mselftouch(pmVar25,"Falling, ",'\x01');
                if (0 < pmVar25->mhp) {
                  iVar9 = rnd((int)pmVar23);
                  piVar1 = &pmVar25->mhp;
                  iVar22 = *piVar1;
                  *piVar1 = *piVar1 - iVar9;
                  if (*piVar1 == 0 || SBORROW4(iVar22,iVar9) != *piVar1 < 0) {
                    if ((viz_array[uVar21][uVar27] & 2U) == 0) {
                      pline("It is destroyed!");
                    }
                    else {
                      if (pmVar25->mtame == '\0') {
                        mon_nam(pmVar25);
                      }
                      else {
                        x_monnam(pmVar25,1,"poor",(uint)(pmVar25->mnamelth != '\0') << 3,'\0');
                      }
                      pline("You destroy %s!");
                    }
                    xkilled(pmVar25,0);
                  }
                }
              }
            }
            else {
              if ((viz_array[uVar21][uVar27] & 2U) != 0) {
                pcVar10 = "";
                if ((uint)(int)u.uy == uVar21 && (uint)(int)u.ux == uVar27) {
                  pcVar10 = " below you";
                }
                pline("KADOOM! The boulder falls into a chasm%s!",pcVar10);
              }
              if (pmVar25 != (monst *)0x0) {
                pmVar25->field_0x62 = pmVar25->field_0x62 & 0x7f;
              }
              obj_extract_self(obj);
              flooreffects(obj,iVar9,iVar22,"");
            }
          }
switchD_001f2b44_caseD_1a:
          lVar26 = lVar26 + 0xc;
        }
        lVar28 = lVar28 + 0xa8;
        lVar11 = lVar11 + 0xfc;
      }
      awaken_monsters(0x690);
      iVar7 = 0x107;
      goto LAB_001f3214;
    }
    goto switchD_001f1ee0_caseD_106;
  }
  exercise(3,'\x01');
  return 2;
switchD_001f1ee0_caseD_106:
  pline("You beat a deafening row!");
  iVar7 = u.ulevel * 0x28;
  goto LAB_001f25aa;
}

Assistant:

int do_play_instrument(struct obj *instr)
{
    char buf[BUFSZ], c = 'y';
    char *s;
    int x,y;
    boolean ok;

    if (Underwater) {
	pline("You can't play music underwater!");
	return 0;
    }
    if (instr->otyp != LEATHER_DRUM && instr->otyp != DRUM_OF_EARTHQUAKE) {
	c = yn("Improvise?");
    }
    if (c == 'n') {
	if (u.uevent.uheard_tune == 2 && yn("Play the passtune?") == 'y') {
	    strcpy(buf, tune);
	} else {
	    getlin("What tune are you playing? [5 notes, A-G]", buf);
	    mungspaces(buf);
	    /* convert to uppercase and change any "H" to the expected "B" */
	    for (s = buf; *s; s++) {
		*s = highc(*s);
		if (*s == 'H') *s = 'B';
	    }
	}
	pline("You extract a strange sound from %s!", the(xname(instr)));
	
	/* Check if there was the Stronghold drawbridge near
	 * and if the tune conforms to what we're waiting for.
	 */
	if (Is_stronghold(&u.uz)) {
	    exercise(A_WIS, TRUE);		/* just for trying */
	    if (!strcmp(buf,tune)) {
		/* Search for the drawbridge */
		for (y=u.uy-1; y<=u.uy+1; y++)
		    for (x=u.ux-1;x<=u.ux+1;x++)
			if (isok(x,y))
			if (find_drawbridge(&x,&y)) {
			    u.uevent.uheard_tune = 2; /* tune now fully known */
			    if (level->locations[x][y].typ == DRAWBRIDGE_DOWN)
				close_drawbridge(x,y);
			    else
				open_drawbridge(x,y);
			    return 1;
			}
	    } else if (flags.soundok) {
		if (u.uevent.uheard_tune < 1) u.uevent.uheard_tune = 1;
		/* Okay, it wasn't the right tune, but perhaps
		 * we can give the player some hints like in the
		 * Mastermind game */
		ok = FALSE;
		for (y = u.uy-1; y <= u.uy+1 && !ok; y++)
		    for (x = u.ux-1; x <= u.ux+1 && !ok; x++)
			if (isok(x,y))
			if (IS_DRAWBRIDGE(level->locations[x][y].typ) ||
			   is_drawbridge_wall(x,y) >= 0)
				ok = TRUE;
		if (ok) { /* There is a drawbridge near */
		    int tumblers, gears;
		    boolean matched[5];

		    tumblers = gears = 0;
		    for (x=0; x < 5; x++)
			matched[x] = FALSE;

		    for (x=0; x < (int)strlen(buf); x++)
			if (x < 5) {
			    if (buf[x] == tune[x]) {
				gears++;
				matched[x] = TRUE;
			    } else
				for (y=0; y < 5; y++)
				    if (!matched[y] &&
				       buf[x] == tune[y] &&
				       buf[y] != tune[y]) {
					tumblers++;
					matched[y] = TRUE;
					break;
				    }
			}
		    if (tumblers)
			if (gears)
			    You_hear("%d tumbler%s click and %d gear%s turn.",
				tumblers, plur(tumblers), gears, plur(gears));
			else
			    You_hear("%d tumbler%s click.",
				tumblers, plur(tumblers));
		    else if (gears) {
			You_hear("%d gear%s turn.", gears, plur(gears));
			/* could only get `gears == 5' by playing five
			   correct notes followed by excess; otherwise,
			   tune would have matched above */
			if (gears == 5) u.uevent.uheard_tune = 2;
		    }
		}
	    }
	  }
	return 1;
    } else
	    return do_improvisation(instr);
}